

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.c
# Opt level: O0

size_t str_countwords(char *src)

{
  ushort **ppuVar1;
  bool bVar2;
  size_t local_18;
  size_t count;
  char *src_local;
  
  local_18 = 0;
  count = (size_t)src;
  if (src != (char *)0x0) {
    while (ppuVar1 = __ctype_b_loc(), ((*ppuVar1)[(int)*(char *)count] & 1) != 0) {
      count = count + 1;
    }
    while( true ) {
      bVar2 = false;
      if (count != 0) {
        bVar2 = *(char *)count != '\0';
      }
      if (!bVar2) break;
      local_18 = local_18 + 1;
      count = (size_t)str_skipnextword((char *)count);
    }
  }
  return local_18;
}

Assistant:

size_t
str_countwords(const char *src) {
  size_t count = 0;

  /* sanity check */
  if (src != NULL) {
    /* skip whitespace prefix */
    while (isblank(*src)) {
      src++;
    }

    while (src != NULL && *src != 0) {
      count++;

      src = str_skipnextword(src);
    }
  }
  return count;
}